

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmi_helper.c
# Opt level: O0

uint64_t helper_psrah_mipsel(uint64_t fs,uint64_t ft)

{
  uint local_24;
  uint64_t uStack_20;
  uint i;
  LMIValue vs;
  uint64_t ft_local;
  uint64_t fs_local;
  
  vs.ub[0] = (uint8_t)(ft & 0x7f);
  if (0xf < (ft & 0x7f)) {
    vs.ub[0] = '\x0f';
  }
  uStack_20 = fs;
  for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
    *(short *)((long)&stack0xffffffffffffffe0 + (ulong)local_24 * 2) =
         (short)((int)*(short *)((long)&stack0xffffffffffffffe0 + (ulong)local_24 * 2) >>
                (vs.ub[0] & 0x1f));
  }
  return uStack_20;
}

Assistant:

uint64_t helper_psrah(uint64_t fs, uint64_t ft)
{
    LMIValue vs;
    unsigned i;

    ft &= 0x7f;
    if (ft > 15) {
        ft = 15;
    }
    vs.d = fs;
    for (i = 0; i < 4; ++i) {
        vs.sh[i] >>= ft;
    }
    return vs.d;
}